

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix33<float> * __thiscall
Imath_2_5::Matrix33<float>::gjInverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  ulong uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined8 *puVar4;
  SingMatrixExc *this_00;
  ulong uVar5;
  long lVar6;
  float *pfVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  undefined8 *puVar14;
  long lVar15;
  undefined8 *puVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Matrix33<float> t;
  Matrix33<float> s;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  
  puVar4 = &local_58;
  uStack_50 = 0;
  uStack_40 = 0;
  local_58 = 0x3f800000;
  local_48 = 0x3f800000;
  local_38 = 1.0;
  pfVar7 = (float *)((long)&uStack_80 + 4);
  local_68 = this->x[2][2];
  local_78 = *(undefined8 *)(this->x[1] + 1);
  uStack_70 = *(undefined8 *)this->x[2];
  local_88 = *(undefined8 *)this->x[0];
  uStack_80 = *(undefined8 *)(this->x[0] + 2);
  uVar5 = 1;
  lVar13 = -2;
  puVar14 = &local_88;
  lVar15 = (long)&uStack_50 + 4;
  pfVar12 = pfVar7;
  uVar19 = 0;
  while (uVar19 != 2) {
    uVar1 = uVar19 + 1;
    fVar22 = *(float *)(&local_88 + uVar19 * 2);
    fVar23 = -fVar22;
    if (-fVar22 <= fVar22) {
      fVar23 = fVar22;
    }
    uVar10 = uVar19 & 0xffffffff;
    lVar9 = lVar13;
    pfVar18 = pfVar7;
    do {
      fVar22 = *pfVar18;
      fVar21 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar21 = fVar22;
      }
      if (fVar23 < fVar21) {
        uVar10 = (ulong)((int)lVar9 + 3);
        fVar23 = fVar21;
      }
      pfVar18 = pfVar18 + 3;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
    if ((fVar23 != 0.0) || (NAN(fVar23))) {
      lVar9 = lVar15;
      uVar11 = uVar5;
      pfVar18 = pfVar12;
      if (uVar19 != uVar10) {
        lVar6 = (long)(int)uVar10 * 0xc;
        lVar17 = 0;
        do {
          uVar2 = *(undefined4 *)((long)puVar14 + lVar17 * 4);
          *(undefined4 *)((long)puVar14 + lVar17 * 4) =
               *(undefined4 *)((long)&local_88 + lVar17 * 4 + lVar6);
          *(undefined4 *)((long)&local_88 + lVar17 * 4 + lVar6) = uVar2;
          uVar2 = *(undefined4 *)((long)puVar4 + lVar17 * 4);
          *(undefined4 *)((long)puVar4 + lVar17 * 4) =
               *(undefined4 *)((long)&local_58 + lVar17 * 4 + lVar6);
          *(undefined4 *)((long)&local_58 + lVar17 * 4 + lVar6) = uVar2;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
      }
      do {
        fVar22 = -*(float *)((long)&local_88 + uVar19 * 4 + uVar11 * 0xc) /
                 *(float *)(&local_88 + uVar19 * 2);
        lVar6 = 0;
        do {
          fVar21 = *(float *)((long)puVar4 + lVar6);
          fVar3 = *(float *)(lVar9 + lVar6);
          *(float *)((long)pfVar18 + lVar6) =
               *(float *)((long)puVar14 + lVar6) * fVar22 + *(float *)((long)pfVar18 + lVar6);
          *(float *)(lVar9 + lVar6) = fVar21 * fVar22 + fVar3;
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0xc);
        bVar20 = uVar11 < 2;
        lVar9 = lVar9 + 0xc;
        uVar11 = uVar11 + 1;
        pfVar18 = pfVar18 + 3;
      } while (bVar20);
    }
    else {
      if (singExc) goto LAB_00125ceb;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
      *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
    }
    uVar5 = uVar5 + 1;
    lVar13 = lVar13 + 1;
    pfVar7 = pfVar7 + 4;
    puVar4 = (undefined8 *)((long)puVar4 + 0xc);
    puVar14 = (undefined8 *)((long)puVar14 + 0xc);
    lVar15 = lVar15 + 0xc;
    pfVar12 = pfVar12 + 3;
    uVar19 = uVar1;
    if ((fVar23 == 0.0) && (!NAN(fVar23))) {
      return __return_storage_ptr__;
    }
  }
  puVar4 = &uStack_40;
  lVar15 = 2;
  puVar14 = &uStack_70;
  do {
    fVar22 = *(float *)(&local_88 + lVar15 * 2);
    if ((fVar22 != 0.0) || (NAN(fVar22))) {
      lVar13 = 0;
      do {
        *(float *)((long)puVar14 + lVar13 * 4) = *(float *)((long)puVar14 + lVar13 * 4) / fVar22;
        *(float *)((long)puVar4 + lVar13 * 4) = *(float *)((long)puVar4 + lVar13 * 4) / fVar22;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      if (lVar15 != 0) {
        lVar13 = 0;
        puVar8 = &local_58;
        puVar16 = &local_88;
        do {
          fVar23 = -*(float *)((long)&local_88 + lVar15 * 4 + lVar13 * 0xc);
          lVar9 = 0;
          do {
            fVar21 = *(float *)((long)puVar4 + lVar9);
            fVar3 = *(float *)((long)puVar8 + lVar9);
            *(float *)((long)puVar16 + lVar9) =
                 *(float *)((long)puVar14 + lVar9) * fVar23 + *(float *)((long)puVar16 + lVar9);
            *(float *)((long)puVar8 + lVar9) = fVar21 * fVar23 + fVar3;
            lVar9 = lVar9 + 4;
          } while (lVar9 != 0xc);
          lVar13 = lVar13 + 1;
          puVar8 = (undefined8 *)((long)puVar8 + 0xc);
          puVar16 = (undefined8 *)((long)puVar16 + 0xc);
        } while (lVar13 != lVar15);
      }
    }
    else {
      if (singExc) {
LAB_00125ceb:
        this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
        Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
        __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
      }
      *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
      *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
    }
    if ((fVar22 == 0.0) && (!NAN(fVar22))) {
      return __return_storage_ptr__;
    }
    puVar4 = (undefined8 *)((long)puVar4 + -0xc);
    puVar14 = (undefined8 *)((long)puVar14 + -0xc);
    bVar20 = lVar15 == 0;
    lVar15 = lVar15 + -1;
    if (bVar20) {
      __return_storage_ptr__->x[2][2] = local_38;
      *(undefined8 *)(__return_storage_ptr__->x[1] + 1) = local_48;
      *(undefined8 *)__return_storage_ptr__->x[2] = uStack_40;
      *(undefined8 *)__return_storage_ptr__->x[0] = local_58;
      *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = uStack_50;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2 ; i++)
    {
        int pivot = i;

        T pivotsize = t[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp = t[i][j];
                t[i][j] = t[pivot][j];
                t[pivot][j] = tmp;

                tmp = s[i][j];
                s[i][j] = s[pivot][j];
                s[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t[j][i] / t[i][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        for (j = 0; j < 3; j++)
        {
            t[i][j] /= f;
            s[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t[j][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    return s;
}